

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  uint uVar4;
  char *pcVar5;
  short *psVar6;
  undefined8 *in_RCX;
  long in_RSI;
  long in_RDI;
  int n_12;
  int n_11;
  int n_10;
  int o1 [2];
  int o0 [2];
  int d3_1 [2];
  int d2_1 [2];
  int d1_1 [2];
  int d0_1 [2];
  int w1_1 [4];
  int w0_1 [4];
  int s3 [4];
  int s2 [4];
  int s1 [4];
  int s0 [4];
  int *out_tile;
  int i_3;
  int *outRow1;
  int *outRow0;
  int j_1;
  Mat out;
  Mat out_tm;
  int p_2;
  int nRowBlocks_2;
  int nColBlocks_2;
  int h_tm_2;
  int w_tm_2;
  Mat top_blob_bordered;
  int n_9;
  int n_8;
  short *k0_3;
  short *r0_4;
  int n_7;
  short *k3_2;
  short *k2_2;
  short *k1_2;
  short *k0_2;
  short *r3_2;
  short *r2_2;
  short *r1_2;
  short *r0_3;
  int q_2;
  int sum0_1 [16];
  int *output0_tm_1;
  int i_2;
  Mat kernel0_tm_1;
  Mat out0_tm_1;
  int p_1;
  int n_6;
  int n_5;
  short *k3_1;
  short *k2_1;
  short *k1_1;
  short *k0_1;
  short *r0_2;
  int n_4;
  short *k3;
  short *k2;
  short *k1;
  short *k0;
  short *r3_1;
  short *r2_1;
  short *r1_1;
  short *r0_1;
  int q_1;
  int sum3 [16];
  int sum2 [16];
  int sum1 [16];
  int sum0 [16];
  int *output3_tm;
  int *output2_tm;
  int *output1_tm;
  int *output0_tm;
  int i_1;
  Mat kernel3_tm;
  Mat kernel2_tm;
  Mat kernel1_tm;
  Mat kernel0_tm;
  Mat out3_tm;
  Mat out2_tm;
  Mat out1_tm;
  Mat out0_tm;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  int tiles_1;
  int nRowBlocks_1;
  int nColBlocks_1;
  int h_tm_1;
  int w_tm_1;
  Mat top_blob_tm;
  int n_3;
  int n_2;
  int n_1;
  int n;
  short t3 [4];
  short t2 [4];
  short t1 [4];
  short t0 [4];
  short w3 [4];
  short w2 [4];
  short w1 [4];
  short w0 [4];
  short d3 [4];
  short d2 [4];
  short d1 [4];
  short d0 [4];
  int i;
  char *r3;
  char *r2;
  char *r1;
  char *r0;
  int j;
  short *out_tm0;
  char *img;
  int q;
  int tiles;
  int nRowBlocks;
  int nColBlocks;
  int h_tm;
  int w_tm;
  Mat bottom_blob_tm;
  Option opt_b;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  Mat *in_stack_fffffffffffff148;
  Mat *in_stack_fffffffffffff150;
  Mat *m;
  Mat *in_stack_fffffffffffff158;
  undefined8 in_stack_fffffffffffff160;
  int _c;
  undefined8 in_stack_fffffffffffff168;
  Mat *in_stack_fffffffffffff170;
  Mat *in_stack_fffffffffffff178;
  undefined8 in_stack_fffffffffffff180;
  float v;
  short *in_stack_fffffffffffff188;
  short *in_stack_fffffffffffff190;
  Mat *in_stack_fffffffffffff198;
  Mat *in_stack_fffffffffffff1a0;
  Option *in_stack_fffffffffffff1b0;
  Option *in_stack_fffffffffffff1b8;
  int local_d34;
  int local_d30;
  int local_d2c;
  int local_d28 [4];
  undefined4 local_d18;
  undefined4 local_d14;
  undefined4 local_d10;
  undefined4 local_d0c;
  undefined4 local_d08;
  undefined4 local_d04;
  int local_d00;
  undefined4 local_cfc;
  int local_cf8 [4];
  int local_ce8 [4];
  int aiStack_cd8 [4];
  int aiStack_cc8 [4];
  int aiStack_cb8 [4];
  int aiStack_ca8 [4];
  int *local_c98;
  int local_c8c;
  int *local_c88;
  Mat *local_c80;
  int local_c74;
  Mat local_c70;
  Mat local_c28;
  int local_bdc;
  int local_bd8;
  int local_bd4;
  int local_bd0;
  int local_bcc;
  Mat local_bc8;
  Mat local_b80;
  int local_b38;
  int local_b34;
  short *local_b30;
  Mat local_b28;
  short *local_ae0;
  int local_ad4;
  short *local_ad0;
  Mat *local_ac8;
  Mat *local_ac0;
  short *local_ab8;
  Mat local_ab0;
  Option *local_a68;
  Mat local_a60;
  short *local_a18;
  Mat local_a10;
  short *local_9c8;
  Mat local_9c0;
  short *local_978;
  int local_96c;
  int local_968 [16];
  int *local_928;
  int local_91c;
  Mat local_918;
  Mat local_8d0;
  int local_884;
  int local_880;
  int local_87c;
  short *local_878;
  short *local_870;
  short *local_868;
  short *local_860;
  Mat local_858;
  short *local_810;
  int local_804;
  short *local_800;
  short *local_7f8;
  short *local_7f0;
  short *local_7e8;
  Mat local_7e0;
  short *local_798;
  Mat local_790;
  short *local_748;
  Mat local_740;
  short *local_6f8;
  Mat local_6f0;
  short *local_6a8;
  int local_69c;
  int local_698 [16];
  int local_658 [16];
  int local_618 [16];
  int local_5d8 [16];
  int *local_598;
  int *local_590;
  int *local_588;
  int *local_580;
  int local_574;
  Mat local_570;
  Mat local_528;
  Mat local_4e0;
  Mat local_498;
  Mat local_450;
  Mat local_408;
  Mat local_3c0;
  Mat local_378;
  int local_32c;
  int local_328;
  int local_324;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  uint local_310;
  uint local_30c;
  Mat local_308;
  Mat local_2c0;
  int local_274;
  int local_270;
  int local_26c;
  int local_268;
  short local_264 [4];
  short local_25c [4];
  short local_254 [4];
  short local_24c [4];
  short local_244 [4];
  short local_23c [4];
  short local_234 [4];
  short local_22c [4];
  short asStack_224 [4];
  short asStack_21c [4];
  short asStack_214 [4];
  short asStack_20c [4];
  int local_204;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  int local_1dc;
  Mat local_1d8;
  short *local_190;
  Mat local_188;
  char *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  uint local_128;
  uint local_124;
  Mat local_120;
  Mat local_c8 [2];
  int local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  
  v = (float)((ulong)in_stack_fffffffffffff180 >> 0x20);
  local_24 = *(undefined4 *)(in_RDI + 0x2c);
  local_28 = *(undefined4 *)(in_RDI + 0x30);
  local_2c = *(int *)(in_RDI + 0x38);
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RSI + 0x38);
  local_20 = in_RCX;
  Mat::Mat(in_stack_fffffffffffff150,in_stack_fffffffffffff148);
  local_30 = (local_30 + 1) - ((int)(local_30 + 1) >> 0x1f) & 0xfffffffe;
  local_34 = (local_34 + 1) - ((int)(local_34 + 1) >> 0x1f) & 0xfffffffe;
  local_24 = local_30 + 2;
  local_28 = local_34 + 2;
  local_c8[0].data = (void *)*local_20;
  local_c8[0].elemsize = local_20[2];
  local_c8[0]._24_8_ = local_20[3];
  local_c8[0].allocator = (Allocator *)local_20[4];
  local_c8[0]._40_8_ = local_20[5];
  local_c8[0]._48_8_ = local_20[6];
  local_c8[0]._56_8_ = local_20[7];
  local_c8[0].refcount = (int *)local_20[2];
  m = local_c8;
  copy_make_border(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                   (int)((ulong)in_stack_fffffffffffff190 >> 0x20),(int)in_stack_fffffffffffff190,
                   (int)((ulong)in_stack_fffffffffffff188 >> 0x20),(int)in_stack_fffffffffffff188,
                   (int)in_stack_fffffffffffff1b0,v,in_stack_fffffffffffff1b8);
  Mat::Mat(&local_120);
  local_124 = (local_30 - ((int)local_30 >> 0x1f)) * 2 & 0xfffffffc;
  local_128 = (local_34 - ((int)local_34 >> 0x1f)) * 2 & 0xfffffffc;
  uVar4 = local_128;
  if ((int)local_128 < 0) {
    uVar4 = local_128 + 3;
  }
  local_12c = (int)uVar4 >> 2;
  uVar4 = local_124;
  if ((int)local_124 < 0) {
    uVar4 = local_124 + 3;
  }
  local_130 = (int)uVar4 >> 2;
  local_134 = local_12c * local_130;
  Mat::create(in_stack_fffffffffffff170,(int)((ulong)in_stack_fffffffffffff168 >> 0x20),
              (int)in_stack_fffffffffffff168,(int)((ulong)in_stack_fffffffffffff160 >> 0x20),
              (size_t)in_stack_fffffffffffff158,(Allocator *)m);
  for (local_138 = 0; local_138 < local_2c; local_138 = local_138 + 1) {
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    pcVar5 = Mat::operator_cast_to_signed_char_(&local_188);
    Mat::~Mat((Mat *)0x2a7ad8);
    local_140 = pcVar5;
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    psVar6 = Mat::operator_cast_to_short_(&local_1d8);
    Mat::~Mat((Mat *)0x2a7b2a);
    local_190 = psVar6;
    for (local_1dc = 0; local_1dc < local_12c; local_1dc = local_1dc + 1) {
      local_1e8 = local_140 + local_24 * local_1dc * 2;
      local_1f0 = local_1e8 + local_24;
      local_1f8 = local_1f0 + local_24;
      local_200 = local_1f0 + local_24 + local_24;
      for (local_204 = 0; local_204 < local_130; local_204 = local_204 + 1) {
        for (local_268 = 0; local_268 < 4; local_268 = local_268 + 1) {
          asStack_20c[local_268] = (short)local_1e8[local_268];
          asStack_214[local_268] = (short)local_1f0[local_268];
          asStack_21c[local_268] = (short)local_1f8[local_268];
          asStack_224[local_268] = (short)local_200[local_268];
        }
        for (local_26c = 0; local_26c < 4; local_26c = local_26c + 1) {
          local_22c[local_26c] = asStack_20c[local_26c] - asStack_21c[local_26c];
          local_234[local_26c] = asStack_214[local_26c] + asStack_21c[local_26c];
          local_23c[local_26c] = asStack_21c[local_26c] - asStack_214[local_26c];
          local_244[local_26c] = asStack_224[local_26c] - asStack_214[local_26c];
        }
        local_24c[0] = local_22c[0];
        local_254[0] = local_22c[1];
        local_25c[0] = local_22c[2];
        local_264[0] = local_22c[3];
        local_24c[1] = local_234[0];
        local_254[1] = local_234[1];
        local_25c[1] = local_234[2];
        local_264[1] = local_234[3];
        local_24c[2] = local_23c[0];
        local_254[2] = local_23c[1];
        local_25c[2] = local_23c[2];
        local_264[2] = local_23c[3];
        local_24c[3] = local_244[0];
        local_254[3] = local_244[1];
        local_25c[3] = local_244[2];
        local_264[3] = local_244[3];
        for (local_270 = 0; local_270 < 4; local_270 = local_270 + 1) {
          asStack_20c[local_270] = local_24c[local_270] - local_25c[local_270];
          asStack_214[local_270] = local_254[local_270] + local_25c[local_270];
          asStack_21c[local_270] = local_25c[local_270] - local_254[local_270];
          asStack_224[local_270] = local_264[local_270] - local_254[local_270];
        }
        for (local_274 = 0; local_274 < 4; local_274 = local_274 + 1) {
          local_190[local_274] = asStack_20c[local_274];
          local_190[local_274 + 4] = asStack_214[local_274];
          local_190[local_274 + 8] = asStack_21c[local_274];
          local_190[local_274 + 0xc] = asStack_224[local_274];
        }
        local_1e8 = local_1e8 + 2;
        local_1f0 = local_1f0 + 2;
        local_1f8 = local_1f8 + 2;
        local_200 = local_200 + 2;
        local_190 = local_190 + 0x10;
      }
    }
  }
  Mat::Mat(&local_2c0);
  Mat::operator=(in_stack_fffffffffffff158,m);
  Mat::~Mat((Mat *)0x2a81c4);
  Mat::Mat(&local_308);
  local_30c = (local_30 - ((int)local_30 >> 0x1f)) * 2 & 0xfffffffc;
  local_310 = (local_34 - ((int)local_34 >> 0x1f)) * 2 & 0xfffffffc;
  uVar4 = local_310;
  if ((int)local_310 < 0) {
    uVar4 = local_310 + 3;
  }
  local_314 = (int)uVar4 >> 2;
  uVar4 = local_30c;
  if ((int)local_30c < 0) {
    uVar4 = local_30c + 3;
  }
  local_318 = (int)uVar4 >> 2;
  local_31c = local_314 * local_318;
  Mat::create(in_stack_fffffffffffff170,(int)((ulong)in_stack_fffffffffffff168 >> 0x20),
              (int)in_stack_fffffffffffff168,(int)((ulong)in_stack_fffffffffffff160 >> 0x20),
              (size_t)in_stack_fffffffffffff158,(Allocator *)m);
  local_320 = local_38 >> 2;
  local_324 = local_320 << 2;
  for (local_328 = 0; local_328 < local_320; local_328 = local_328 + 1) {
    local_32c = local_328 << 2;
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    for (local_574 = 0; local_574 < local_31c; local_574 = local_574 + 1) {
      local_580 = Mat::row<int>(&local_378,local_574);
      local_588 = Mat::row<int>(&local_3c0,local_574);
      local_590 = Mat::row<int>(&local_408,local_574);
      local_598 = Mat::row<int>(&local_450,local_574);
      memset(local_5d8,0,0x40);
      memset(local_618,0,0x40);
      memset(local_658,0,0x40);
      memset(local_698,0,0x40);
      for (local_69c = 0; local_69c + 3 < local_2c; local_69c = local_69c + 4) {
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        psVar6 = Mat::row<short>(&local_6f0,local_574);
        Mat::~Mat((Mat *)0x2a8573);
        local_6a8 = psVar6;
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        psVar6 = Mat::row<short>(&local_740,local_574);
        Mat::~Mat((Mat *)0x2a85d4);
        local_6f8 = psVar6;
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        psVar6 = Mat::row<short>(&local_790,local_574);
        Mat::~Mat((Mat *)0x2a8636);
        local_748 = psVar6;
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        psVar6 = Mat::row<short>(&local_7e0,local_574);
        Mat::~Mat((Mat *)0x2a8698);
        local_798 = psVar6;
        local_7e8 = Mat::row<short>(&local_498,local_69c);
        local_7f0 = Mat::row<short>(&local_4e0,local_69c);
        local_7f8 = Mat::row<short>(&local_528,local_69c);
        local_800 = Mat::row<short>(&local_570,local_69c);
        for (local_804 = 0; psVar3 = local_7e8, psVar2 = local_7f0, psVar1 = local_7f8,
            psVar6 = local_800, local_804 < 0x10; local_804 = local_804 + 1) {
          local_5d8[local_804] =
               (int)local_6a8[local_804] * (int)local_7e8[local_804] + local_5d8[local_804];
          local_7e8 = local_7e8 + 0x10;
          local_5d8[local_804] =
               (int)local_6f8[local_804] * (int)local_7e8[local_804] + local_5d8[local_804];
          local_7e8 = psVar3 + 0x20;
          local_5d8[local_804] =
               (int)local_748[local_804] * (int)(psVar3 + 0x20)[local_804] + local_5d8[local_804];
          local_7e8 = psVar3 + 0x30;
          local_5d8[local_804] =
               (int)local_798[local_804] * (int)(psVar3 + 0x30)[local_804] + local_5d8[local_804];
          local_7e8 = psVar3;
          local_618[local_804] =
               (int)local_6a8[local_804] * (int)local_7f0[local_804] + local_618[local_804];
          local_7f0 = local_7f0 + 0x10;
          local_618[local_804] =
               (int)local_6f8[local_804] * (int)local_7f0[local_804] + local_618[local_804];
          local_7f0 = psVar2 + 0x20;
          local_618[local_804] =
               (int)local_748[local_804] * (int)(psVar2 + 0x20)[local_804] + local_618[local_804];
          local_7f0 = psVar2 + 0x30;
          local_618[local_804] =
               (int)local_798[local_804] * (int)(psVar2 + 0x30)[local_804] + local_618[local_804];
          local_7f0 = psVar2;
          local_658[local_804] =
               (int)local_6a8[local_804] * (int)local_7f8[local_804] + local_658[local_804];
          local_7f8 = local_7f8 + 0x10;
          local_658[local_804] =
               (int)local_6f8[local_804] * (int)local_7f8[local_804] + local_658[local_804];
          local_7f8 = psVar1 + 0x20;
          local_658[local_804] =
               (int)local_748[local_804] * (int)(psVar1 + 0x20)[local_804] + local_658[local_804];
          local_7f8 = psVar1 + 0x30;
          local_658[local_804] =
               (int)local_798[local_804] * (int)(psVar1 + 0x30)[local_804] + local_658[local_804];
          local_7f8 = psVar1;
          local_698[local_804] =
               (int)local_6a8[local_804] * (int)local_800[local_804] + local_698[local_804];
          local_800 = local_800 + 0x10;
          local_698[local_804] =
               (int)local_6f8[local_804] * (int)local_800[local_804] + local_698[local_804];
          local_800 = psVar6 + 0x20;
          local_698[local_804] =
               (int)local_748[local_804] * (int)(psVar6 + 0x20)[local_804] + local_698[local_804];
          local_800 = psVar6 + 0x30;
          local_698[local_804] =
               (int)local_798[local_804] * (int)(psVar6 + 0x30)[local_804] + local_698[local_804];
          local_800 = psVar6;
        }
      }
      for (; local_69c < local_2c; local_69c = local_69c + 1) {
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        psVar6 = Mat::row<short>(&local_858,local_574);
        Mat::~Mat((Mat *)0x2a8e70);
        local_810 = psVar6;
        local_860 = Mat::row<short>(&local_498,local_69c);
        local_868 = Mat::row<short>(&local_4e0,local_69c);
        local_870 = Mat::row<short>(&local_528,local_69c);
        local_878 = Mat::row<short>(&local_570,local_69c);
        for (local_87c = 0; local_87c < 0x10; local_87c = local_87c + 1) {
          local_5d8[local_87c] =
               (int)local_810[local_87c] * (int)local_860[local_87c] + local_5d8[local_87c];
          local_618[local_87c] =
               (int)local_810[local_87c] * (int)local_868[local_87c] + local_618[local_87c];
          local_658[local_87c] =
               (int)local_810[local_87c] * (int)local_870[local_87c] + local_658[local_87c];
          local_698[local_87c] =
               (int)local_810[local_87c] * (int)local_878[local_87c] + local_698[local_87c];
        }
      }
      for (local_880 = 0; local_880 < 0x10; local_880 = local_880 + 1) {
        local_580[local_880] = local_5d8[local_880];
        local_588[local_880] = local_618[local_880];
        local_590[local_880] = local_658[local_880];
        local_598[local_880] = local_698[local_880];
      }
    }
    Mat::~Mat((Mat *)0x2a915f);
    Mat::~Mat((Mat *)0x2a916c);
    Mat::~Mat((Mat *)0x2a9179);
    Mat::~Mat((Mat *)0x2a9186);
    Mat::~Mat((Mat *)0x2a9193);
    Mat::~Mat((Mat *)0x2a91a0);
    Mat::~Mat((Mat *)0x2a91ad);
    Mat::~Mat((Mat *)0x2a91ba);
  }
  for (local_884 = local_324; _c = (int)((ulong)in_stack_fffffffffffff160 >> 0x20),
      local_884 < local_38; local_884 = local_884 + 1) {
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    for (local_91c = 0; local_91c < local_31c; local_91c = local_91c + 1) {
      local_928 = Mat::row<int>(&local_8d0,local_91c);
      memset(local_968,0,0x40);
      for (local_96c = 0; local_96c + 3 < local_2c; local_96c = local_96c + 4) {
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        psVar6 = Mat::row<short>(&local_9c0,local_91c);
        Mat::~Mat((Mat *)0x2a9360);
        local_978 = psVar6;
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        psVar6 = Mat::row<short>(&local_a10,local_91c);
        Mat::~Mat((Mat *)0x2a93c1);
        local_9c8 = psVar6;
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        psVar6 = Mat::row<short>(&local_a60,local_91c);
        Mat::~Mat((Mat *)0x2a941d);
        local_a18 = psVar6;
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        in_stack_fffffffffffff1b0 = (Option *)Mat::row<short>(&local_ab0,local_91c);
        Mat::~Mat((Mat *)0x2a9476);
        local_a68 = in_stack_fffffffffffff1b0;
        local_ab8 = Mat::row<short>(&local_918,local_96c);
        in_stack_fffffffffffff1a0 = (Mat *)Mat::row<short>(&local_918,local_96c + 1);
        local_ac0 = in_stack_fffffffffffff1a0;
        in_stack_fffffffffffff198 = (Mat *)Mat::row<short>(&local_918,local_96c + 2);
        local_ac8 = in_stack_fffffffffffff198;
        in_stack_fffffffffffff190 = Mat::row<short>(&local_918,local_96c + 3);
        local_ad0 = in_stack_fffffffffffff190;
        for (local_ad4 = 0; local_ad4 < 0x10; local_ad4 = local_ad4 + 1) {
          local_968[local_ad4] =
               (int)local_978[local_ad4] * (int)local_ab8[local_ad4] + local_968[local_ad4];
          local_968[local_ad4] =
               (int)local_9c8[local_ad4] *
               (int)*(short *)((long)&local_ac0->data + (long)local_ad4 * 2) + local_968[local_ad4];
          local_968[local_ad4] =
               (int)local_a18[local_ad4] *
               (int)*(short *)((long)&local_ac8->data + (long)local_ad4 * 2) + local_968[local_ad4];
          local_968[local_ad4] =
               (int)*(short *)(&local_a68->lightmode + (long)local_ad4 * 2) *
               (int)in_stack_fffffffffffff190[local_ad4] + local_968[local_ad4];
        }
      }
      for (; local_96c < local_2c; local_96c = local_96c + 1) {
        Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
        in_stack_fffffffffffff178 = &local_b28;
        psVar6 = Mat::row<short>(in_stack_fffffffffffff178,local_91c);
        Mat::~Mat((Mat *)0x2a9711);
        local_ae0 = psVar6;
        in_stack_fffffffffffff188 = Mat::row<short>(&local_918,local_96c);
        local_b30 = in_stack_fffffffffffff188;
        for (local_b34 = 0; local_b34 < 0x10; local_b34 = local_b34 + 1) {
          local_968[local_b34] =
               (int)local_ae0[local_b34] * (int)in_stack_fffffffffffff188[local_b34] +
               local_968[local_b34];
        }
      }
      for (local_b38 = 0; local_b38 < 0x10; local_b38 = local_b38 + 1) {
        local_928[local_b38] = local_968[local_b38];
      }
    }
    Mat::~Mat((Mat *)0x2a9836);
    Mat::~Mat((Mat *)0x2a9843);
  }
  Mat::Mat(&local_b80);
  Mat::operator=(in_stack_fffffffffffff158,m);
  Mat::~Mat((Mat *)0x2a989e);
  Mat::Mat(&local_bc8);
  Mat::create(in_stack_fffffffffffff170,(int)((ulong)in_stack_fffffffffffff168 >> 0x20),
              (int)in_stack_fffffffffffff168,_c,(size_t)in_stack_fffffffffffff158,(Allocator *)m);
  local_bcc = (int)local_30 / 2 << 2;
  local_bd0 = (int)local_34 / 2 << 2;
  local_bd4 = local_bd0 / 4;
  local_bd8 = local_bcc / 4;
  for (local_bdc = 0; local_bdc < local_38; local_bdc = local_bdc + 1) {
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    Mat::channel(in_stack_fffffffffffff178,(int)((ulong)in_stack_fffffffffffff170 >> 0x20));
    for (local_c74 = 0; local_c74 < local_bd4; local_c74 = local_c74 + 1) {
      in_stack_fffffffffffff170 = (Mat *)Mat::row<int>(&local_c70,local_c74 * 2);
      local_c80 = in_stack_fffffffffffff170;
      local_c88 = Mat::row<int>(&local_c70,local_c74 * 2 + 1);
      for (local_c8c = 0; local_c8c < local_bd8; local_c8c = local_c8c + 1) {
        local_c98 = Mat::row<int>(&local_c28,local_c74 * local_bd8 + local_c8c);
        for (local_d2c = 0; local_d2c < 4; local_d2c = local_d2c + 1) {
          aiStack_ca8[local_d2c] = local_c98[local_d2c];
          aiStack_cb8[local_d2c] = local_c98[local_d2c + 4];
          aiStack_cc8[local_d2c] = local_c98[local_d2c + 8];
          aiStack_cd8[local_d2c] = local_c98[local_d2c + 0xc];
        }
        for (local_d30 = 0; local_d30 < 4; local_d30 = local_d30 + 1) {
          local_ce8[local_d30] =
               aiStack_ca8[local_d30] + aiStack_cb8[local_d30] + aiStack_cc8[local_d30];
          local_d28[(long)local_d30 + 0xc] =
               (aiStack_cb8[local_d30] - aiStack_cc8[local_d30]) + aiStack_cd8[local_d30];
        }
        local_d00 = local_ce8[0];
        local_cfc = local_cf8[0];
        local_d08 = local_ce8[1];
        local_d04 = local_cf8[1];
        local_d10 = local_ce8[2];
        local_d0c = local_cf8[2];
        local_d18 = local_ce8[3];
        local_d14 = local_cf8[3];
        for (local_d34 = 0; local_d34 < 2; local_d34 = local_d34 + 1) {
          local_d28[(long)local_d34 + 2] =
               local_d28[(long)local_d34 + 10] + local_d28[(long)local_d34 + 8] +
               local_d28[(long)local_d34 + 6];
          local_d28[local_d34] =
               (local_d28[(long)local_d34 + 8] - local_d28[(long)local_d34 + 6]) +
               local_d28[(long)local_d34 + 4];
        }
        *(int *)&local_c80->data = local_d28[2] >> 2;
        *(int *)((long)&local_c80->data + 4) = local_d28[3] >> 2;
        *local_c88 = local_d28[0] >> 2;
        local_c88[1] = local_d28[1] >> 2;
        local_c80 = (Mat *)&local_c80->refcount;
        local_c88 = local_c88 + 2;
      }
    }
    Mat::~Mat((Mat *)0x2a9e24);
    Mat::~Mat((Mat *)0x2a9e31);
  }
  copy_cut_border(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198,
                  (int)((ulong)in_stack_fffffffffffff190 >> 0x20),(int)in_stack_fffffffffffff190,
                  (int)((ulong)in_stack_fffffffffffff188 >> 0x20),(int)in_stack_fffffffffffff188,
                  in_stack_fffffffffffff1b0);
  Mat::~Mat((Mat *)0x2a9eab);
  Mat::~Mat((Mat *)0x2a9eb8);
  Mat::~Mat((Mat *)0x2a9ec5);
  Mat::~Mat((Mat *)0x2a9ed2);
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4], d1[4], d2[4], d3[4];
                    short w0[4], w1[4], w2[4], w3[4];
                    short t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q + 1);
                    const short* k2 = kernel0_tm.row<short>(q + 2);
                    const short* k3 = kernel0_tm.row<short>(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j = 0; j < nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j * 2);
                int* outRow1 = out.row<int>(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j * nRowBlocks + i);

                    int s0[4], s1[4], s2[4], s3[4];
                    int w0[4], w1[4];
                    int d0[2], d1[2], d2[2], d3[2];
                    int o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}